

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

Format __thiscall
QRhiImplementation::shaderDescVariableFormatToVertexInputFormat
          (QRhiImplementation *this,VariableType type)

{
  VariableType type_local;
  QRhiImplementation *this_local;
  Format local_4;
  
  switch(type) {
  case Float:
    local_4 = Float;
    break;
  case Vec2:
    local_4 = Float2;
    break;
  case Vec3:
    local_4 = Float3;
    break;
  case Vec4:
    local_4 = Float4;
    break;
  default:
    break;
  case Int:
    local_4 = SInt;
    break;
  case Int2:
    local_4 = SInt2;
    break;
  case Int3:
    local_4 = SInt3;
    break;
  case Int4:
    local_4 = SInt4;
    break;
  case Uint:
    local_4 = UInt;
    break;
  case Uint2:
    local_4 = UInt2;
    break;
  case Uint3:
    local_4 = UInt3;
    break;
  case Uint4:
    local_4 = UInt4;
    break;
  case Half:
    local_4 = Half;
    break;
  case Half2:
    local_4 = Half2;
    break;
  case Half3:
    local_4 = Half3;
    break;
  case Half4:
    local_4 = Half4;
  }
  return local_4;
}

Assistant:

QRhiVertexInputAttribute::Format QRhiImplementation::shaderDescVariableFormatToVertexInputFormat(QShaderDescription::VariableType type) const
{
    switch (type) {
    case QShaderDescription::Vec4:
        return QRhiVertexInputAttribute::Float4;
    case QShaderDescription::Vec3:
        return QRhiVertexInputAttribute::Float3;
    case QShaderDescription::Vec2:
        return QRhiVertexInputAttribute::Float2;
    case QShaderDescription::Float:
        return QRhiVertexInputAttribute::Float;

    case QShaderDescription::Int4:
        return QRhiVertexInputAttribute::SInt4;
    case QShaderDescription::Int3:
        return QRhiVertexInputAttribute::SInt3;
    case QShaderDescription::Int2:
        return QRhiVertexInputAttribute::SInt2;
    case QShaderDescription::Int:
        return QRhiVertexInputAttribute::SInt;

    case QShaderDescription::Uint4:
        return QRhiVertexInputAttribute::UInt4;
    case QShaderDescription::Uint3:
        return QRhiVertexInputAttribute::UInt3;
    case QShaderDescription::Uint2:
        return QRhiVertexInputAttribute::UInt2;
    case QShaderDescription::Uint:
        return QRhiVertexInputAttribute::UInt;

    case QShaderDescription::Half4:
        return QRhiVertexInputAttribute::Half4;
    case QShaderDescription::Half3:
        return QRhiVertexInputAttribute::Half3;
    case QShaderDescription::Half2:
        return QRhiVertexInputAttribute::Half2;
    case QShaderDescription::Half:
        return QRhiVertexInputAttribute::Half;

    default:
        Q_UNREACHABLE_RETURN(QRhiVertexInputAttribute::Float);
    }
}